

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void test<long>(long expected,string *value)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  AssertHelper *this_00;
  char *pcVar1;
  char *in_R9;
  AssertHelper AStack_68;
  AssertHelper local_60;
  bool valid;
  long result2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult gtest_ar;
  long expected_local;
  long result;
  
  this_00 = &AStack_68;
  pcVar1 = (value->_M_dataplus)._M_p;
  expected_local = expected;
  result = jsteemann::atoi<long>(pcVar1,pcVar1 + value->_M_string_length,&valid);
  this = &local_48;
  result2 = CONCAT71(result2._1_7_,valid);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (valid == false) {
    testing::Message::Message((Message *)&AStack_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&result2,(AssertionResult *)0x143744,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&AStack_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"expected","result",&expected_local,&result);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pcVar1 = (value->_M_dataplus)._M_p;
      result2 = jsteemann::atoi_unchecked<long>(pcVar1,pcVar1 + value->_M_string_length);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"expected","result2",&expected_local,&result2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&AStack_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x1c,pcVar1);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&AStack_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&AStack_68);
      }
      this = &gtest_ar.message_;
      goto LAB_00125911;
    }
    testing::Message::Message((Message *)&result2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x19,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&result2);
    this = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    this_00 = (AssertHelper *)&result2;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_00125911:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this);
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}